

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

CommandOptions * read_PCM_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  _func_int **__s;
  bool bVar1;
  int iVar2;
  ui32_t uVar3;
  ui32_t uVar4;
  long *plVar5;
  Dictionary *pDVar6;
  byte_t *pbVar7;
  unsigned_long_long *puVar8;
  AESDecContext *this;
  HMACContext *this_00;
  IFileReaderFactory *in_RDX;
  long local_740;
  AudioDescriptor *local_6e8;
  WavFileWriter local_680;
  Result_t local_618 [108];
  uint local_5ac;
  Result_t local_5a8 [4];
  ui32_t i;
  undefined1 local_540 [112];
  WriterInfo Info;
  WavFileWriter local_3c0;
  WaveAudioDescriptor local_358 [104];
  undefined1 local_2f0 [8];
  AudioDescriptor ADesc;
  SourceClip *sourceClip;
  undefined4 local_1e4;
  Result_t local_1e0 [104];
  long local_178;
  InterchangeObject *tmp_obj;
  string local_168 [32];
  string local_148 [8];
  Result_t result;
  Rational local_e0;
  AudioDescriptor *local_d8;
  WaveAudioDescriptor *wave_descriptor;
  undefined1 local_c8 [4];
  ui32_t last_frame;
  WavFileWriter OutWave;
  undefined1 local_68 [8];
  FrameBuffer FrameBuffer;
  MXFReader Reader;
  HMACContext *HMAC;
  AESDecContext *Context;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  
  AS_02::PCM::MXFReader::MXFReader((MXFReader *)&FrameBuffer.field_0x20,in_RDX);
  ASDCP::PCM::FrameBuffer::FrameBuffer((FrameBuffer *)local_68);
  WavFileWriter::WavFileWriter((WavFileWriter *)local_c8);
  wave_descriptor._4_4_ = 0;
  local_d8 = (AudioDescriptor *)0x0;
  ASDCP::Rational::Rational(&local_e0,0,0);
  bVar1 = ASDCP::Rational::operator==((Rational *)(fileReaderFactory + 5),&local_e0);
  if (bVar1) {
    fileReaderFactory[5]._vptr_IFileReaderFactory = ASDCP::EditRate_24;
  }
  __s = fileReaderFactory[0xb]._vptr_IFileReaderFactory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,(char *)__s,(allocator<char> *)((long)&tmp_obj + 7));
  AS_02::PCM::MXFReader::OpenRead(local_148,(Rational *)&FrameBuffer.field_0x20);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tmp_obj + 7));
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
  if (-1 < iVar2) {
    if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
    }
    local_178 = 0;
    plVar5 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
    pDVar6 = (Dictionary *)ASDCP::DefaultCompositeDict();
    pbVar7 = ASDCP::Dictionary::ul(pDVar6,MDD_WaveAudioDescriptor);
    (**(code **)(*plVar5 + 0xa8))(local_1e0,plVar5,pbVar7);
    Kumu::Result_t::operator=((Result_t *)local_148,local_1e0);
    Kumu::Result_t::~Result_t(local_1e0);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
    if (-1 < iVar2) {
      if (local_178 == 0) {
        local_6e8 = (AudioDescriptor *)0x0;
      }
      else {
        local_6e8 = (AudioDescriptor *)
                    __dynamic_cast(local_178,&ASDCP::MXF::InterchangeObject::typeinfo,
                                   &ASDCP::MXF::WaveAudioDescriptor::typeinfo);
      }
      local_d8 = local_6e8;
      if (local_6e8 == (AudioDescriptor *)0x0) {
        fprintf(_stderr,"File does not contain an essence descriptor.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_00112559;
      }
      if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
        (**(code **)((long)local_6e8->EditRate + 0x88))(local_6e8,0);
      }
      puVar8 = ASDCP::MXF::optional_property<unsigned_long_long>::get
                         ((optional_property<unsigned_long_long> *)&local_d8[5].AudioSamplingRate);
      if (*puVar8 == 0) {
        fprintf(_stderr,
                "ContainerDuration not set in file descriptor, attempting to use index duration.\n")
        ;
        AS_02::PCM::MXFReader::AS02IndexReader();
        wave_descriptor._4_4_ = AS_02::MXF::AS02IndexReader::GetDuration();
      }
      else {
        bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                          ((optional_property<unsigned_long_long> *)&local_d8[5].AudioSamplingRate);
        if (!bVar1) {
          puVar8 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                             ((optional_property *)&local_d8[5].AudioSamplingRate);
          wave_descriptor._4_4_ = (uint)*puVar8;
        }
      }
      if (wave_descriptor._4_4_ == 0) {
        fprintf(_stderr,
                "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n")
        ;
        plVar5 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
        pDVar6 = (Dictionary *)ASDCP::DefaultCompositeDict();
        pbVar7 = ASDCP::Dictionary::ul(pDVar6,MDD_SourceClip);
        (**(code **)(*plVar5 + 0xa8))(&sourceClip,plVar5,pbVar7);
        Kumu::Result_t::operator=((Result_t *)local_148,(Result_t *)&sourceClip);
        Kumu::Result_t::~Result_t((Result_t *)&sourceClip);
        iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
        if (-1 < iVar2) {
          if (local_178 == 0) {
            local_740 = 0;
          }
          else {
            local_740 = __dynamic_cast(local_178,&ASDCP::MXF::InterchangeObject::typeinfo,
                                       &ASDCP::MXF::SourceClip::typeinfo);
          }
          bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                            ((optional_property<unsigned_long_long> *)(local_740 + 0xc0));
          if (!bVar1) {
            puVar8 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                               ((optional_property *)(local_740 + 0xc0));
            wave_descriptor._4_4_ = (uint)*puVar8;
          }
        }
      }
      if (wave_descriptor._4_4_ == 0) {
        fprintf(_stderr,"Unable to determine file duration.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_00112559;
      }
      if (local_d8 == (AudioDescriptor *)0x0) {
        __assert_fail("wave_descriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-unwrap.cpp"
                      ,0x2c1,
                      "Result_t read_PCM_file(CommandOptions &, const Kumu::IFileReaderFactory &)");
      }
      AS_02::MXF::CalcFrameBufferSize
                ((WaveAudioDescriptor *)local_d8,(Rational *)(fileReaderFactory + 5));
      ASDCP::FrameBuffer::Capacity((int)&ADesc + 0x28);
      Kumu::Result_t::~Result_t((Result_t *)&ADesc.ContainerDuration);
      wave_descriptor._4_4_ =
           AS_02::MXF::CalcFramesFromDurationInSamples
                     (wave_descriptor._4_4_,(WaveAudioDescriptor *)local_d8,
                      (Rational *)(fileReaderFactory + 5));
    }
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
  if (-1 < iVar2) {
    if ((*(int *)&fileReaderFactory[3]._vptr_IFileReaderFactory != 0) &&
       (*(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory < wave_descriptor._4_4_)) {
      wave_descriptor._4_4_ = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
    }
    if (*(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4) != 0) {
      if (wave_descriptor._4_4_ <
          *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4)) {
        fprintf(_stderr,"Start value greater than file duration.\n");
        Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_FAIL);
        goto LAB_00112559;
      }
      wave_descriptor._4_4_ =
           Kumu::xmin<unsigned_int>
                     (*(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4) +
                      wave_descriptor._4_4_,wave_descriptor._4_4_);
    }
    wave_descriptor._4_4_ =
         wave_descriptor._4_4_ - *(int *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
    ASDCP::PCM::AudioDescriptor::AudioDescriptor((AudioDescriptor *)local_2f0);
    ASDCP::MD_to_PCM_ADesc(local_358,local_d8);
    Kumu::Result_t::operator=((Result_t *)local_148,(Result_t *)local_358);
    Kumu::Result_t::~Result_t((Result_t *)local_358);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
    if (-1 < iVar2) {
      ADesc.AvgBps = wave_descriptor._4_4_;
      local_2f0 = *(undefined1 (*) [8])(fileReaderFactory + 5);
      WavFileWriter::OpenWrite
                (&local_3c0,(AudioDescriptor *)local_c8,local_2f0,
                 (SplitType_t)fileReaderFactory[6]._vptr_IFileReaderFactory);
      Kumu::Result_t::operator=((Result_t *)local_148,(Result_t *)&local_3c0);
      Kumu::Result_t::~Result_t((Result_t *)&local_3c0);
    }
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
  if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x100) != 0)) {
    this = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this);
    ASDCP::AESDecContext::InitKey((uchar *)&Info.LabelSetType);
    Kumu::Result_t::operator=((Result_t *)local_148,(Result_t *)&Info.LabelSetType);
    Kumu::Result_t::~Result_t((Result_t *)&Info.LabelSetType);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
    if ((-1 < iVar2) && (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000) != 0)) {
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)(local_540 + 0x68));
      AS_02::PCM::MXFReader::FillWriterInfo((WriterInfo *)local_540);
      Kumu::Result_t::~Result_t((Result_t *)local_540);
      if ((Info.CryptographicKeyID[9] & 1) == 0) {
        fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
      }
      else {
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_5a8,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)local_148,local_5a8);
        Kumu::Result_t::~Result_t(local_5a8);
      }
      ASDCP::WriterInfo::~WriterInfo((WriterInfo *)(local_540 + 0x68));
    }
  }
  local_5ac = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
  while (iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148),
        -1 < iVar2 && local_5ac < wave_descriptor._4_4_) {
    AS_02::PCM::MXFReader::ReadFrame
              ((uint)local_618,(FrameBuffer *)&FrameBuffer.field_0x20,
               (AESDecContext *)(ulong)local_5ac,(HMACContext *)local_68);
    Kumu::Result_t::operator=((Result_t *)local_148,local_618);
    Kumu::Result_t::~Result_t(local_618);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)local_148);
    if (-1 < iVar2) {
      if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
        ASDCP::FrameBuffer::FrameNumber((FrameBuffer *)local_68,local_5ac);
        ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)local_68,(uint)_stderr);
      }
      uVar3 = ASDCP::FrameBuffer::Size((FrameBuffer *)local_68);
      uVar4 = ASDCP::FrameBuffer::Capacity((FrameBuffer *)local_68);
      if (uVar3 != uVar4) {
        fprintf(_stderr,"Last frame is incomplete, padding with zeros.\n");
        uVar3 = ASDCP::FrameBuffer::Capacity((FrameBuffer *)local_68);
        ASDCP::FrameBuffer::Size((FrameBuffer *)local_68,uVar3);
      }
      WavFileWriter::WriteFrame(&local_680,(FrameBuffer *)local_c8);
      Kumu::Result_t::operator=((Result_t *)local_148,(Result_t *)&local_680);
      Kumu::Result_t::~Result_t((Result_t *)&local_680);
    }
    local_5ac = local_5ac + 1;
  }
  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)local_148);
LAB_00112559:
  local_1e4 = 1;
  Kumu::Result_t::~Result_t((Result_t *)local_148);
  WavFileWriter::~WavFileWriter((WavFileWriter *)local_c8);
  ASDCP::PCM::FrameBuffer::~FrameBuffer((FrameBuffer *)local_68);
  AS_02::PCM::MXFReader::~MXFReader((MXFReader *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
read_PCM_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::PCM::MXFReader     Reader(fileReaderFactory);
  PCM::FrameBuffer   FrameBuffer;
  WavFileWriter      OutWave;
  ui32_t last_frame = 0;
  ASDCP::MXF::WaveAudioDescriptor *wave_descriptor = 0;

  if ( Options.edit_rate == ASDCP::Rational(0,0) ) // todo, make this available to the CLI
    {
      Options.edit_rate = EditRate_24;
    }

  Result_t result = Reader.OpenRead(Options.input_filename, Options.edit_rate);

  if ( KM_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
      
      ASDCP::MXF::InterchangeObject* tmp_obj = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_WaveAudioDescriptor), &tmp_obj);

      if ( KM_SUCCESS(result) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);

	  if ( wave_descriptor == 0 )
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      return RESULT_FAIL;
	    }
      
	  if ( Options.verbose_flag )
	    {
	      wave_descriptor->Dump();
	    }

	  if ( wave_descriptor->ContainerDuration.get() == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
	      last_frame = Reader.AS02IndexReader().GetDuration();
	    }
	  else
	    {
              if ( ! wave_descriptor->ContainerDuration.empty() )
                {
	          last_frame = (ui32_t)wave_descriptor->ContainerDuration;
                }
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
	      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
	      if ( KM_SUCCESS(result))
		{
	    	  ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
	    	  if ( ! sourceClip->Duration.empty() )
		    {
		      last_frame = (ui32_t)sourceClip->Duration;
		    }
		}
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "Unable to determine file duration.\n");
	      return RESULT_FAIL;
	    }

	  assert(wave_descriptor);
	  FrameBuffer.Capacity(AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, Options.edit_rate));
	  last_frame = AS_02::MXF::CalcFramesFromDurationInSamples(last_frame, *wave_descriptor, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.duration > 0 && Options.duration < last_frame )
	last_frame = Options.duration;

      if ( Options.start_frame > 0 )
	{
	  if ( Options.start_frame > last_frame )
	    {
	      fprintf(stderr, "Start value greater than file duration.\n");
	      return RESULT_FAIL;
	    }

	  last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
	}

      last_frame = last_frame - Options.start_frame;

      PCM::AudioDescriptor ADesc;

      result = MD_to_PCM_ADesc(wave_descriptor, ADesc);

      if ( ASDCP_SUCCESS(result) )
	{
	  ADesc.ContainerDuration = last_frame;
	  ADesc.EditRate = Options.edit_rate;

	  result = OutWave.OpenWrite(ADesc, Options.file_prefix,
				     ( Options.split_wav ? WavFileWriter::ST_STEREO : 
				       ( Options.mono_wav ? WavFileWriter::ST_MONO : WavFileWriter::ST_NONE ) ));
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    {
	      FrameBuffer.FrameNumber(i);
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }

	  if ( FrameBuffer.Size() != FrameBuffer.Capacity() )
	    {
	      fprintf(stderr, "Last frame is incomplete, padding with zeros.\n");
	      // actually, it has already been zeroed for us, we just need to recognize the appropriate size
	      FrameBuffer.Size(FrameBuffer.Capacity());
	    }

	  result = OutWave.WriteFrame(FrameBuffer);
	}
    }

  return result;
}